

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_pcnt_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws)

{
  fpr_t *pfVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar2 = (pfVar1->fs[0] >> 1 & 0x55555555) + (pfVar1->fs[0] & 0x55555555);
  uVar3 = (pfVar1->fs[1] >> 1 & 0x55555555) + (pfVar1->fs[1] & 0x55555555);
  uVar4 = (pfVar1->fs[2] >> 1 & 0x55555555) + (pfVar1->fs[2] & 0x55555555);
  uVar5 = (pfVar1->fs[3] >> 1 & 0x55555555) + (pfVar1->fs[3] & 0x55555555);
  uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
  uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
  uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
  uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
  uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
  uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
  uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
  uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar1->fs[0] = (uVar2 >> 0x10) + (uVar2 & 0x1f);
  pfVar1->fs[1] = (uVar3 >> 0x10) + (uVar3 & 0x1f);
  pfVar1->fs[2] = (uVar4 >> 0x10) + (uVar4 & 0x1f);
  pfVar1->fs[3] = (uVar5 >> 0x10) + (uVar5 & 0x1f);
  return;
}

Assistant:

void helper_msa_pcnt_w(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->w[0]  = msa_pcnt_df(DF_WORD, pws->w[0]);
    pwd->w[1]  = msa_pcnt_df(DF_WORD, pws->w[1]);
    pwd->w[2]  = msa_pcnt_df(DF_WORD, pws->w[2]);
    pwd->w[3]  = msa_pcnt_df(DF_WORD, pws->w[3]);
}